

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O1

int __thiscall gulcalc::init(gulcalc *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int *piVar2;
  int gulstream_type;
  undefined4 local_1c;
  timespec local_18;
  
  local_1c = 0x1000001;
  if (this->itemWriter_ != (_func_void_void_ptr_int_int *)0x0) {
    (*this->itemWriter_)(&local_1c,4,1);
    (*this->itemWriter_)(&this->samplesize_,4,1);
  }
  if (this->coverageWriter_ != (_func_void_void_ptr_int_int *)0x0) {
    local_1c = 0x1000002;
    (*this->coverageWriter_)(&local_1c,4,1);
    (*this->coverageWriter_)(&this->samplesize_,4,1);
  }
  if (this->lossWriter_ != (_func_void_void_ptr_int_int *)0x0) {
    local_1c = 0x2000001;
    (*this->lossWriter_)(&local_1c,4,1);
    (*this->lossWriter_)(&this->samplesize_,4,1);
  }
  if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
    local_1c = 0x2000001;
    (*this->correlatedWriter_)(&local_1c,4,1);
    (*this->correlatedWriter_)(&this->samplesize_,4,1);
  }
  local_18.tv_sec = 1;
  local_18.tv_nsec = 0;
  do {
    uVar1 = nanosleep(&local_18,&local_18);
    piVar2 = (int *)(ulong)uVar1;
    if (uVar1 != 0xffffffff) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  return (int)piVar2;
}

Assistant:

void gulcalc::init()
{
	int	gulstream_type = gul_item_stream | gulstream_id;

	if (itemWriter_ != 0) {
		itemWriter_(&gulstream_type, sizeof(gulstream_type), 1);
		itemWriter_(&samplesize_, sizeof(samplesize_), 1);
	}
	
	if (coverageWriter_ != 0) {
        gulstream_type = gul_coverage_stream | gulstream_id;
		coverageWriter_(&gulstream_type, sizeof(gulstream_type), 1);
		coverageWriter_(&samplesize_, sizeof(samplesize_), 1);
	}

	if (lossWriter_ != 0) {
            gulstream_type = gul_item_stream | loss_stream_id;
            lossWriter_(&gulstream_type, sizeof(gulstream_type), 1);
            lossWriter_(&samplesize_, sizeof(samplesize_), 1);
    }

	if(correlatedWriter_ != 0) {
	    gulstream_type = gul_item_stream | loss_stream_id;
	    correlatedWriter_(&gulstream_type, sizeof(gulstream_type), 1);
	    correlatedWriter_(&samplesize_, sizeof(samplesize_), 1);
	}

	std::this_thread::sleep_for(std::chrono::milliseconds(PIPE_DELAY));
}